

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

void duckdb::DateTruncFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  BaseScalarFunction *pBVar1;
  long in_RDI;
  ScalarFunction *func;
  BaseScalarFunction *function;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  allocator_type local_5d9;
  allocator local_5d8 [24];
  LogicalType local_5c0 [24];
  _Function_base local_5a8;
  code *local_590;
  _Function_base local_588;
  code *local_570;
  _Function_base local_568;
  code *local_550;
  LogicalType local_548 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_530;
  LogicalType local_518 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_500;
  LogicalType local_4e8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_4d0;
  LogicalType local_4b8 [24];
  LogicalType local_4a0 [24];
  LogicalType local_488 [24];
  string local_470 [32];
  ScalarFunction local_450;
  ScalarFunction local_328;
  ScalarFunction local_200;
  BaseScalarFunction local_d8 [176];
  
  std::__cxx11::string::string(local_470,"date_trunc",local_5d8);
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  std::__cxx11::string::~string(local_470);
  duckdb::LogicalType::LogicalType((LogicalType *)local_5d8,VARCHAR);
  duckdb::LogicalType::LogicalType(local_5c0,TIMESTAMP);
  __l._M_len = 2;
  __l._M_array = (iterator)local_5d8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_4d0,__l,&local_5d9);
  duckdb::LogicalType::LogicalType(local_4e8,TIMESTAMP);
  local_568._M_functor._8_8_ = 0;
  local_568._M_functor._M_unused._M_object =
       DateTruncFunction<duckdb::timestamp_t,duckdb::timestamp_t>;
  local_550 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_568._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_488,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_200,&local_4d0,local_4e8,&local_568,DateTruncBind,0,0,0,local_488,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(in_RDI + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_200);
  ScalarFunction::~ScalarFunction(&local_200);
  duckdb::LogicalType::~LogicalType(local_488);
  std::_Function_base::~_Function_base(&local_568);
  duckdb::LogicalType::~LogicalType(local_4e8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_4d0);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_5d8 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType((LogicalType *)local_5d8,VARCHAR);
  duckdb::LogicalType::LogicalType(local_5c0,DATE);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_5d8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_500,__l_00,&local_5d9);
  duckdb::LogicalType::LogicalType(local_518,TIMESTAMP);
  local_588._M_functor._8_8_ = 0;
  local_588._M_functor._M_unused._M_object = DateTruncFunction<duckdb::date_t,duckdb::timestamp_t>;
  local_570 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_588._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_4a0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_328,&local_500,local_518,&local_588,DateTruncBind,0,0,0,local_4a0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_328);
  ScalarFunction::~ScalarFunction(&local_328);
  duckdb::LogicalType::~LogicalType(local_4a0);
  std::_Function_base::~_Function_base(&local_588);
  duckdb::LogicalType::~LogicalType(local_518);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_500);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_5d8 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType((LogicalType *)local_5d8,VARCHAR);
  duckdb::LogicalType::LogicalType(local_5c0,INTERVAL);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_5d8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_530,__l_01,&local_5d9);
  duckdb::LogicalType::LogicalType(local_548,INTERVAL);
  local_5a8._M_functor._8_8_ = 0;
  local_5a8._M_functor._M_unused._M_object =
       DateTruncFunction<duckdb::interval_t,duckdb::interval_t>;
  local_590 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_5a8._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_4b8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_450,&local_530,local_548,&local_5a8,0,0,0,0,local_4b8,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_450);
  ScalarFunction::~ScalarFunction(&local_450);
  duckdb::LogicalType::~LogicalType(local_4b8);
  std::_Function_base::~_Function_base(&local_5a8);
  duckdb::LogicalType::~LogicalType(local_548);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_530);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_5d8 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  for (function = *(BaseScalarFunction **)(in_RDI + 0x20); function != pBVar1;
      function = function + 0x128) {
    BaseScalarFunction::SetReturnsError(local_d8,function);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_d8);
  }
  return;
}

Assistant:

ScalarFunctionSet DateTruncFun::GetFunctions() {
	ScalarFunctionSet date_trunc("date_trunc");
	date_trunc.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIMESTAMP}, LogicalType::TIMESTAMP,
	                                      DateTruncFunction<timestamp_t, timestamp_t>, DateTruncBind));
	date_trunc.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::DATE}, LogicalType::TIMESTAMP,
	                                      DateTruncFunction<date_t, timestamp_t>, DateTruncBind));
	date_trunc.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::INTERVAL}, LogicalType::INTERVAL,
	                                      DateTruncFunction<interval_t, interval_t>));
	for (auto &func : date_trunc.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return date_trunc;
}